

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int32_t float128_to_int32_aarch64(float128 a,float_status *status)

{
  int32_t iVar1;
  uint64_t absZ;
  byte zSign;
  ulong uVar2;
  uint64_t aSig1;
  ushort uVar3;
  
  uVar2 = (ulong)(a.low != 0) | a.high & 0xffffffffffff;
  uVar3 = a.high._6_2_ & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
    absZ = uVar2 + 0x1000000000000;
    if (0x4027 < uVar3) goto LAB_005e8e45;
    uVar2 = 1;
    if (0x3fe8 < uVar3) {
      absZ = (ulong)(absZ << (a.high._6_1_ + 0x18U & 0x3f) != 0) |
             absZ >> (0x28U - (char)uVar3 & 0x3f);
      goto LAB_005e8e45;
    }
  }
  absZ = (uint64_t)(uVar2 != 0);
LAB_005e8e45:
  zSign = 0;
  if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
      a.low == 0) {
    zSign = a.high._7_1_ >> 7;
  }
  if (uVar3 != 0x7fff) {
    zSign = a.high._7_1_ >> 7;
  }
  iVar1 = roundAndPackInt32(zSign,absZ,status);
  return iVar1;
}

Assistant:

int32_t float128_to_int32(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( ( aExp == 0x7FFF ) && ( aSig0 | aSig1 ) ) aSign = 0;
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    aSig0 |= ( aSig1 != 0 );
    shiftCount = 0x4028 - aExp;
    if ( 0 < shiftCount ) shift64RightJamming( aSig0, shiftCount, &aSig0 );
    return roundAndPackInt32(aSign, aSig0, status);

}